

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbsessionmanager.cpp
# Opt level: O3

bool __thiscall QXcbSessionManager::allowsInteraction(QXcbSessionManager *this)

{
  int iVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = true;
  if (sm_interactionActive == '\0') {
    if (!sm_waitingForInteraction) {
      if (sm_interactStyle == 2) {
        iVar1 = SmcInteractRequest(smcConnection,1,sm_interactCallback,this);
        sm_waitingForInteraction = iVar1 != 0;
      }
      if (sm_waitingForInteraction != false) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        QEventLoop::QEventLoop((QEventLoop *)&local_38,(QObject *)0x0);
        this->m_eventLoop = (QEventLoop *)&local_38;
        QEventLoop::exec(&local_38,0);
        this->m_eventLoop = (QEventLoop *)0x0;
        sm_waitingForInteraction = false;
        if (sm_smActive != '\0') {
          sm_interactionActive = '\x01';
          qt_sm_blockUserInput = false;
          QEventLoop::~QEventLoop((QEventLoop *)&local_38);
          goto LAB_0018272f;
        }
        QEventLoop::~QEventLoop((QEventLoop *)&local_38);
      }
    }
    bVar2 = false;
  }
LAB_0018272f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QXcbSessionManager::allowsInteraction()
{
    if (sm_interactionActive)
        return true;

    if (sm_waitingForInteraction)
        return false;

    if (sm_interactStyle == SmInteractStyleAny) {
        sm_waitingForInteraction = SmcInteractRequest(smcConnection,
                                                      SmDialogNormal,
                                                      sm_interactCallback,
                                                      (SmPointer*) this);
    }
    if (sm_waitingForInteraction) {
        QEventLoop eventLoop;
        m_eventLoop = &eventLoop;
        eventLoop.exec();
        m_eventLoop = nullptr;

        sm_waitingForInteraction = false;
        if (sm_smActive) { // not cancelled
            sm_interactionActive = true;
            qt_sm_blockUserInput = false;
            return true;
        }
    }
    return false;
}